

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void int_linear(vec<int> *_a,vec<IntVar_*> *_x,IntRelType t,IntVar *y,BoolView *r)

{
  ulong uVar1;
  long lVar2;
  vec<int> a;
  vec<IntVar_*> x;
  vec<int> local_68;
  vec<IntVar_*> local_58;
  BoolView *local_40;
  IntVar *local_38;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (int *)0x0;
  local_40 = r;
  local_38 = y;
  if (_a->sz != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      vec<int>::push(&local_68,(int *)((long)_a->data + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 4;
    } while (uVar1 < _a->sz);
  }
  local_58.sz = 0xffffffff;
  vec<int>::push(&local_68,(int *)&local_58);
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (IntVar **)0x0;
  if (_x->sz != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      vec<IntVar_*>::push(&local_58,(IntVar **)((long)_x->data + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar1 < _x->sz);
  }
  vec<IntVar_*>::push(&local_58,&local_38);
  int_linear(&local_68,&local_58,t,0,local_40);
  if (local_58.data != (IntVar **)0x0) {
    free(local_58.data);
  }
  if (local_68.data != (int *)0x0) {
    free(local_68.data);
  }
  return;
}

Assistant:

void int_linear(vec<int>& _a, vec<IntVar*>& _x, IntRelType t, IntVar* y, const BoolView& r) {
	vec<int> a;
	for (unsigned int i = 0; i < _a.size(); i++) {
		a.push(_a[i]);
	}
	a.push(-1);
	vec<IntVar*> x;
	for (unsigned int i = 0; i < _x.size(); i++) {
		x.push(_x[i]);
	}
	x.push(y);
	int_linear(a, x, t, 0, r);
}